

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O0

void test_filled_and_inverted_text(wins *wins_ar,int ar_len,Am_Style *bs)

{
  Am_Drawonable *pAVar1;
  Am_Drawonable *font_win;
  int i;
  Am_Style *bs_local;
  int ar_len_local;
  wins *wins_ar_local;
  
  for (font_win._4_4_ = 0; font_win._4_4_ < ar_len; font_win._4_4_ = font_win._4_4_ + 1) {
    pAVar1 = wins_ar[font_win._4_4_].font_win;
    (**(code **)(*(long *)pAVar1 + 0x170))(pAVar1,&black,"FILLED",6,&font_large,0x5a,400,0,bs,0);
    (**(code **)(*(long *)pAVar1 + 0x170))(pAVar1,&black,"INVERTED",8,&font_large,0x5a,0x1ae,0,bs,1)
    ;
    (**(code **)(*(long *)pAVar1 + 0xa0))();
  }
  return;
}

Assistant:

void
test_filled_and_inverted_text(wins *wins_ar, int ar_len, Am_Style &bs)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    font_win->Draw_Text(black, "FILLED", 6, font_large, 90, 400, Am_DRAW_COPY,
                        bs, false);
    font_win->Draw_Text(black, "INVERTED", 8, font_large, 90, 430, Am_DRAW_COPY,
                        bs, true);
    font_win->Flush_Output();
  }
}